

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_simple_key_abi_cxx11_
          (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  location *loc_00;
  detail *pdVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *ppVar8;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  result<toml::detail::region,_toml::detail::none_t> bare;
  value_type reg;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bstr;
  allocator_type local_209;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  region local_1c8;
  region local_180;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 local_120 [120];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  local_88;
  
  pdVar7 = this;
  parse_basic_string_abi_cxx11_
            ((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_120,this,loc);
  if (local_120[0] == true) {
    pvVar4 = result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_120);
    pvVar5 = result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_120);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)local_1e8,&(pvVar4->first).str,&pvVar5->second);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::pair(&local_88,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
            *)local_1e8);
    __return_storage_ptr__->is_ok_ = true;
    ppVar8 = &local_88;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::pair(&(__return_storage_ptr__->field_1).succ.value,&local_88);
    success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
    ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_88);
    region::~region(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      ppVar8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)(local_1d8._M_allocated_capacity + 1);
      operator_delete((void *)local_1e8._0_8_,(ulong)ppVar8);
    }
    result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_120,(EVP_PKEY_CTX *)ppVar8);
  }
  else {
    result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_120,(EVP_PKEY_CTX *)pdVar7);
    pdVar7 = this;
    parse_literal_string_abi_cxx11_
              ((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_120,this,loc_00);
    if (local_120[0] == true) {
      pvVar4 = result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::unwrap((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_120);
      pvVar5 = result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::unwrap((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_120);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                  *)local_1e8,&(pvVar4->first).str,&pvVar5->second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
      ::pair(&local_88,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
              *)local_1e8);
      __return_storage_ptr__->is_ok_ = true;
      ppVar8 = &local_88;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
      ::pair(&(__return_storage_ptr__->field_1).succ.value,&local_88);
      success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
      ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                  *)&local_88);
      region::~region(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
        ppVar8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                  *)(local_1d8._M_allocated_capacity + 1);
        operator_delete((void *)local_1e8._0_8_,(ulong)ppVar8);
      }
      result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_120,(EVP_PKEY_CTX *)ppVar8);
    }
    else {
      result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup((result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_120,(EVP_PKEY_CTX *)pdVar7);
      repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<'a',_'z'>,_toml::detail::in_range<'A',_'Z'>_>,_toml::detail::in_range<'0',_'9'>,_toml::detail::character<'-'>,_toml::detail::character<'_'>_>,_toml::detail::at_least<1UL>_>
      ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_1e8,(location *)this);
      bVar3 = local_1e8[0];
      if (local_1e8[0] == true) {
        pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)local_1e8);
        region::region(&local_180,pvVar6);
        make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                  (&local_208,(detail *)local_180.first_._M_current,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                   local_180.last_._M_current,in_RCX);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_88,&local_208,&local_180);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)local_120,&local_88);
        __return_storage_ptr__->is_ok_ = true;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
        ::pair(&(__return_storage_ptr__->field_1).succ.value,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)local_120);
        success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
        ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                    *)local_120);
        region::~region(&local_88.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
          operator_delete(local_88.first._M_dataplus._M_p,
                          local_88.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        region::~region(&local_180);
      }
      if (local_1e8[0] == true) {
        region::~region((region *)(local_1e8 + 8));
      }
      if (bVar3 == false) {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,"toml::parse_simple_key: ","");
        source_location::source_location((source_location *)&local_88,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[35],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_120,(source_location *)&local_88,
                   (char (*) [35])"the next token is not a simple key");
        __l._M_len = 1;
        __l._M_array = (iterator)local_120;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_138,__l,&local_209);
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)&local_180,&local_208,&local_138,&local_a8,false);
        p_Var2 = &local_180.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_180.super_region_base._vptr_region_base == p_Var2) {
          local_1d8._8_8_ = local_180.source_name_._M_dataplus._M_p;
          local_1e8._0_8_ = &local_1d8;
        }
        else {
          local_1e8._0_8_ = local_180.super_region_base._vptr_region_base;
        }
        local_1d8._M_allocated_capacity._1_7_ =
             local_180.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._1_7_;
        local_1d8._M_local_buf[0] =
             local_180.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._0_1_;
        __return_storage_ptr__->is_ok_ = false;
        paVar1 = &(__return_storage_ptr__->field_1).succ.value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_1 = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._0_8_ == &local_1d8) {
          paVar1->_M_allocated_capacity = local_1d8._M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.first.field_2 + 8) =
               local_1d8._8_8_;
        }
        else {
          (__return_storage_ptr__->field_1).succ.value.first._M_dataplus._M_p =
               (pointer)local_1e8._0_8_;
          (__return_storage_ptr__->field_1).succ.value.first.field_2._M_allocated_capacity =
               local_1d8._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_1).succ.value.first._M_string_length =
             (size_type)
             local_180.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_1d8._M_allocated_capacity =
             (ulong)local_180.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._1_7_ << 8;
        local_180.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_1_ = 0;
        local_180.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_1e8._8_8_ = (_func_int **)0x0;
        local_1e8._0_8_ = &local_1d8;
        local_180.super_region_base._vptr_region_base = (_func_int **)p_Var2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_138);
        if ((undefined1 *)local_120._80_8_ != local_120 + 0x60) {
          operator_delete((void *)local_120._80_8_,local_120._96_8_ + 1);
        }
        source_location::~source_location((source_location *)local_120);
        source_location::~source_location((source_location *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<key, region>, std::string>
parse_simple_key(location& loc)
{
    if(const auto bstr = parse_basic_string(loc))
    {
        return ok(std::make_pair(bstr.unwrap().first.str, bstr.unwrap().second));
    }
    if(const auto lstr = parse_literal_string(loc))
    {
        return ok(std::make_pair(lstr.unwrap().first.str, lstr.unwrap().second));
    }
    if(const auto bare = lex_unquoted_key::invoke(loc))
    {
        const auto reg = bare.unwrap();
        return ok(std::make_pair(reg.str(), reg));
    }
    return err(format_underline("toml::parse_simple_key: ",
            {{source_location(loc), "the next token is not a simple key"}}));
}